

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

GLenum glcts::PipelineStatisticsQueryUtilities::getEnumForPrimitiveType
                 (_primitive_type primitive_type)

{
  TestError *this;
  
  if (primitive_type < PRIMITIVE_TYPE_COUNT) {
    return *(GLenum *)(&DAT_016f7514 + (ulong)primitive_type * 4);
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Unrecognized primitive type",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
             ,0x282);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

glw::GLenum PipelineStatisticsQueryUtilities::getEnumForPrimitiveType(_primitive_type primitive_type)
{
	glw::GLenum result = GL_NONE;

	switch (primitive_type)
	{
	case PRIMITIVE_TYPE_POINTS:
		result = GL_POINTS;
		break;
	case PRIMITIVE_TYPE_LINE_LOOP:
		result = GL_LINE_LOOP;
		break;
	case PRIMITIVE_TYPE_LINE_STRIP:
		result = GL_LINE_STRIP;
		break;
	case PRIMITIVE_TYPE_LINES:
		result = GL_LINES;
		break;
	case PRIMITIVE_TYPE_LINES_ADJACENCY:
		result = GL_LINES_ADJACENCY;
		break;
	case PRIMITIVE_TYPE_PATCHES:
		result = GL_PATCHES;
		break;
	case PRIMITIVE_TYPE_TRIANGLE_FAN:
		result = GL_TRIANGLE_FAN;
		break;
	case PRIMITIVE_TYPE_TRIANGLE_STRIP:
		result = GL_TRIANGLE_STRIP;
		break;
	case PRIMITIVE_TYPE_TRIANGLES:
		result = GL_TRIANGLES;
		break;
	case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
		result = GL_TRIANGLES_ADJACENCY;
		break;

	default:
	{
		TCU_FAIL("Unrecognized primitive type");
	}
	} /* switch (primitive_type) */

	return result;
}